

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planetri.cpp
# Opt level: O2

void intersect(float *p1,float *p2,float *split,float *plane)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  fVar7 = DistToPt(p1,plane);
  fVar1 = p2[1];
  fVar2 = p2[2];
  fVar3 = p1[1];
  fVar4 = p1[2];
  auVar9 = ZEXT416((uint)(*p2 - *p1));
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)((fVar1 - fVar3) * plane[1])),auVar9,ZEXT416((uint)*plane))
  ;
  auVar6._8_4_ = 0x80000000;
  auVar6._0_8_ = 0x8000000080000000;
  auVar6._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(ZEXT416((uint)(plane[3] + (fVar7 - plane[3]))),auVar6);
  auVar5 = vfmadd231ss_fma(auVar5,ZEXT416((uint)(fVar2 - fVar4)),ZEXT416((uint)plane[2]));
  auVar8._0_4_ = auVar6._0_4_ / auVar5._0_4_;
  auVar8._4_12_ = auVar6._4_12_;
  auVar5 = vfmadd213ss_fma(auVar9,auVar8,ZEXT416((uint)*p1));
  *split = auVar5._0_4_;
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar1 - fVar3)),auVar8,ZEXT416((uint)p1[1]));
  split[1] = auVar5._0_4_;
  auVar5 = vfmadd213ss_fma(auVar8,ZEXT416((uint)(fVar2 - fVar4)),ZEXT416((uint)p1[2]));
  split[2] = auVar5._0_4_;
  return;
}

Assistant:

static void intersect(const float *p1,const float *p2,float *split,const float *plane)
{

  float dp1 = DistToPt(p1,plane);

  float dir[3];

  dir[0] = p2[0] - p1[0];
  dir[1] = p2[1] - p1[1];
  dir[2] = p2[2] - p1[2];

  float dot1 = dir[0]*plane[0] + dir[1]*plane[1] + dir[2]*plane[2];
  float dot2 = dp1 - plane[3];

  float    t = -(plane[3] + dot2 ) / dot1;

  split[0] = (dir[0]*t)+p1[0];
  split[1] = (dir[1]*t)+p1[1];
  split[2] = (dir[2]*t)+p1[2];

}